

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

int extract2fd(archive *a,char *pathname,int fd)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  size_t sVar5;
  ssize_t sVar6;
  char *__s;
  void *__dest;
  int *piVar7;
  int rv;
  size_t sVar8;
  uint uVar9;
  char *__s_00;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  uchar *__buf;
  
  uVar9 = (uint)a_opt;
  bVar3 = false;
  uVar10 = 0;
  bVar4 = 0;
  while( true ) {
    __buf = buffer;
    if ((((uVar10 & 3) == 0 && fd != 1) & tty) == 1) {
      info(" %c\b\b",(ulong)(uint)(int)"|/-\\"[(uint)(uVar10 >> 2) & 3]);
    }
    sVar5 = archive_read_data(a,buffer,0x2000);
    if ((int)sVar5 != 0 && (long)sVar5 < 0) {
      __s = archive_error_string(a);
      __s_00 = "%s";
      errorx("%s");
      if (__s_00 == (char *)0x0) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(__s_00);
        sVar5 = sVar5 + 1;
      }
      sVar8 = strlen(__s);
      __dest = malloc(sVar8 + sVar5 + 1);
      if (__dest == (void *)0x0) {
        piVar7 = __errno_location();
        *piVar7 = 0xc;
        error("malloc()");
      }
      if (__s_00 != (char *)0x0) {
        memcpy(__dest,__s_00,sVar5);
        *(undefined1 *)((long)__dest + (sVar5 - 1)) = 0x2f;
      }
      memcpy((void *)((long)__dest + sVar5),__s,sVar8 + 1);
      return (int)__dest;
    }
    if (((bVar4 & a_opt) == 1) &&
       (((bVar4 = 0, sVar5 == 0 || (buffer[0] != '\n')) && (sVar6 = write(fd,"\r",1), sVar6 != 1))))
    break;
    if (sVar5 == 0) {
      return uVar9;
    }
    if (((int)uVar10 == 0 & a_opt) == 1) {
      bVar2 = true;
      sVar8 = 0;
      do {
        bVar1 = buffer[sVar8];
        if ((bVar1 < 0x20) && ((0xf3ffc07fU >> (bVar1 & 0x1f) & 1) != 0)) {
          bVar2 = true;
          break;
        }
        if ((0x1f < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)) {
          bVar2 = false;
        }
        sVar8 = sVar8 + 1;
      } while (sVar5 != sVar8);
      if (bVar2) {
        uVar9 = 0;
      }
    }
    if ((a_opt & uVar9 != 0) == 1) {
      if (0 < (long)sVar5) {
        pbVar11 = buffer + sVar5;
        pbVar12 = buffer;
LAB_00105223:
        do {
          bVar2 = !bVar3;
          bVar3 = true;
          if (bVar2) {
            bVar3 = false;
            if ((*pbVar12 < 0x20) && ((0xf3ffc07fU >> (*pbVar12 & 0x1f) & 1) != 0)) {
              warningx("%s may be corrupted due to weak text file detection heuristic",pathname);
              bVar3 = true;
            }
          }
          if (*pbVar12 == 0xd) {
            if (pbVar12 + 1 == pbVar11) {
              bVar4 = 1;
            }
            else if (pbVar12[1] != 10) goto LAB_00105258;
          }
          else {
LAB_00105258:
            pbVar12 = pbVar12 + 1;
            if (pbVar12 < pbVar11) goto LAB_00105223;
          }
          sVar5 = write(fd,__buf,(long)pbVar12 - (long)__buf);
          if (sVar5 != (long)pbVar12 - (long)__buf) goto LAB_001052ef;
          __buf = pbVar12 + 1;
          pbVar12 = __buf;
        } while (__buf < pbVar11);
      }
    }
    else {
      sVar8 = write(fd,buffer,sVar5);
      if (sVar8 != sVar5) break;
    }
    uVar10 = (ulong)((int)uVar10 + 1);
  }
LAB_001052ef:
  error("write(\'%s\')",pathname);
}

Assistant:

static int
extract2fd(struct archive *a, char *pathname, int fd)
{
	int cr, text, warn;
	ssize_t len;
	unsigned char *p, *q, *end;

	text = a_opt;
	warn = 0;
	cr = 0;

	/* loop over file contents and write to fd */
	for (int n = 0; ; n++) {
		if (fd != STDOUT_FILENO)
			if (tty && (n % 4) == 0)
				info(" %c\b\b", spinner[(n / 4) % sizeof spinner]);

		len = archive_read_data(a, buffer, sizeof buffer);

		if (len < 0)
			ac(len);

		/* left over CR from previous buffer */
		if (a_opt && cr) {
			if (len == 0 || buffer[0] != '\n')
				if (write(fd, "\r", 1) != 1)
					error("write('%s')", pathname);
			cr = 0;
		}

		/* EOF */
		if (len == 0)
			break;
		end = buffer + len;

		/*
		 * Detect whether this is a text file.  The correct way to
		 * do this is to check the least significant bit of the
		 * "internal file attributes" field of the corresponding
		 * file header in the central directory, but libarchive
		 * does not provide access to this field, so we have to
		 * guess by looking for non-ASCII characters in the
		 * buffer.  Hopefully we won't guess wrong.  If we do
		 * guess wrong, we print a warning message later.
		 */
		if (a_opt && n == 0) {
			if (check_binary(buffer, len))
				text = 0;
		}

		/* simple case */
		if (!a_opt || !text) {
			if (write(fd, buffer, len) != len)
				error("write('%s')", pathname);
			continue;
		}

		/* hard case: convert \r\n to \n (sigh...) */
		for (p = buffer; p < end; p = q + 1) {
			for (q = p; q < end; q++) {
				if (!warn && BYTE_IS_BINARY(*q)) {
					warningx("%s may be corrupted due"
					    " to weak text file detection"
					    " heuristic", pathname);
					warn = 1;
				}
				if (q[0] != '\r')
					continue;
				if (&q[1] == end) {
					cr = 1;
					break;
				}
				if (q[1] == '\n')
					break;
			}
			if (write(fd, p, q - p) != q - p)
				error("write('%s')", pathname);
		}
	}

	return text;
}